

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O3

DataAddress * __thiscall
Rml::DataModel::ResolveAddress
          (DataAddress *__return_storage_ptr__,DataModel *this,String *address_str,Element *element)

{
  pointer pDVar1;
  code *pcVar2;
  pointer pDVar3;
  int iVar4;
  DataModel *pDVar5;
  bool bVar6;
  long lVar7;
  size_t sVar8;
  DataModel *pDVar9;
  const_iterator cVar10;
  DataAddress *pDVar11;
  Node *pNVar12;
  char cVar13;
  pointer pbVar14;
  DataAddress address;
  int index;
  StringList list;
  DataAddress local_d8;
  int local_bc;
  vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> local_b8;
  DataModel *local_98;
  int local_8c;
  undefined1 local_88 [32];
  StringList local_68;
  String *local_48;
  Element *local_40;
  pointer local_38;
  
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = address_str;
  local_40 = element;
  StringUtilities::ExpandString(&local_68,address_str,'.');
  local_b8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::reserve
            (&local_b8,
             (long)local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_38 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = this;
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar14 = local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pbVar14->_M_string_length == 0) {
LAB_001f80d5:
        local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        goto LAB_001f80fa;
      }
      cVar13 = (char)pbVar14;
      lVar7 = ::std::__cxx11::string::find(cVar13,0x5b);
      if (lVar7 == 0) goto LAB_001f80d5;
      ::std::__cxx11::string::substr((ulong)local_88,(ulong)pbVar14);
      ::std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>::
      emplace_back<std::__cxx11::string>
                ((vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>> *)&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      if ((Element *)local_88._0_8_ != (Element *)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      while (lVar7 != -1) {
        lVar7 = ::std::__cxx11::string::find(cVar13,0x5d);
        if (lVar7 == -1) {
          local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          goto LAB_001f80fa;
        }
        ::std::__cxx11::string::substr((ulong)local_88,(ulong)pbVar14);
        local_bc = -1;
        __isoc99_sscanf(local_88._0_8_,"%d",&local_bc);
        iVar4 = local_bc;
        if ((Element *)local_88._0_8_ != (Element *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
        }
        local_8c = iVar4;
        if (iVar4 < 0) goto LAB_001f80d5;
        ::std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>::
        emplace_back<int&>((vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>> *)
                           &local_b8,&local_8c);
        lVar7 = ::std::__cxx11::string::find(cVar13,0x5b);
      }
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 != local_38);
  }
  if (((local_b8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_b8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) ||
      (local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
       _M_impl.super__Vector_impl_data._M_start =
            local_b8.
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
            _M_impl.super__Vector_impl_data._M_start,
      local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_b8.
           super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
           .super__Vector_impl_data._M_finish,
      ((local_b8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_start)->name)._M_string_length == 0)) &&
     (bVar6 = Assert("RMLUI_ASSERT(!address.empty() && !address[0].name.empty())",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataModel.cpp"
                     ,0x49),
     local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
     _M_impl.super__Vector_impl_data._M_start =
          local_b8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_start,
     local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
     _M_impl.super__Vector_impl_data._M_finish =
          local_b8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish, !bVar6)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_b8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_001f80fa:
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector(&local_b8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  pDVar5 = local_98;
  pDVar1 = local_d8.
           super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->
    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    sVar8 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::findIdx<std::__cxx11::string>
                      ((Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                        *)&local_98->variables,
                       &(local_d8.
                         super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->name);
    if ((pDVar5->variables).mKeyVals + sVar8 == (Node *)(pDVar5->variables).mInfo) {
      local_88._0_8_ = local_40;
      while ((pDVar11 = __return_storage_ptr__, (Element *)local_88._0_8_ != (Element *)0x0 &&
             (pDVar9 = Element::GetDataModel((Element *)local_88._0_8_), pDVar9 == local_98))) {
        sVar8 = robin_hood::detail::
                Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>
                ::findIdx<Rml::Element*>
                          ((Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>
                            *)&pDVar5->aliases,(Element **)local_88);
        pNVar12 = (local_98->aliases).mKeyVals + sVar8;
        if ((pNVar12 != (Node *)(local_98->aliases).mInfo) &&
           (cVar10 = itlib::
                     flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>
                     ::find<std::__cxx11::string>
                               ((flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>
                                 *)&(pNVar12->mData).second,&pDVar1->name),
           pDVar3 = local_d8.
                    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
           cVar10._M_current !=
           *(pointer *)
            ((long)&(pNVar12->mData).second.m_container.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8))) {
          pDVar1 = ((cVar10._M_current)->second).
                   super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((pDVar1 != ((cVar10._M_current)->second).
                         super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish) &&
             ((pDVar1->name)._M_string_length != 0)) {
            ::std::__cxx11::string::_M_assign
                      ((string *)
                       local_d8.
                       super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            pDVar3->index = pDVar1->index;
            ::std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<Rml::DataAddressEntry_const*,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>
                      ((vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>> *)
                       &local_d8,
                       local_d8.
                       super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,
                       ((cVar10._M_current)->second).
                       super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,
                       ((cVar10._M_current)->second).
                       super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            (__return_storage_ptr__->
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
            _M_impl.super__Vector_impl_data._M_start =
                 local_d8.
                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (__return_storage_ptr__->
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
            _M_impl.super__Vector_impl_data._M_finish =
                 local_d8.
                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (__return_storage_ptr__->
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_d8.
                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            pDVar11 = &local_d8;
          }
          goto LAB_001f8204;
        }
        local_88._0_8_ = Element::GetParentNode((Element *)local_88._0_8_);
      }
      Log::Message(LT_WARNING,"Could not find variable name \'%s\' in data model.",
                   (local_48->_M_dataplus)._M_p);
LAB_001f8204:
      (pDVar11->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar11->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pDVar11->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_001f8212;
    }
    (__return_storage_ptr__->
    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  }
  (__return_storage_ptr__->
  super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_001f8212:
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

DataAddress DataModel::ResolveAddress(const String& address_str, Element* element) const
{
	DataAddress address = ParseAddress(address_str);

	if (address.empty())
		return address;

	const String& first_name = address.front().name;

	auto it = variables.find(first_name);
	if (it != variables.end())
		return address;

	// Look for a variable alias for the first name.

	Element* ancestor = element;
	while (ancestor && ancestor->GetDataModel() == this)
	{
		auto it_element = aliases.find(ancestor);
		if (it_element != aliases.end())
		{
			const auto& alias_names = it_element->second;
			auto it_alias_name = alias_names.find(first_name);
			if (it_alias_name != alias_names.end())
			{
				const DataAddress& replace_address = it_alias_name->second;
				if (replace_address.empty() || replace_address.front().name.empty())
				{
					// Variable alias is invalid
					return DataAddress();
				}

				// Insert the full alias address, replacing the first element.
				address[0] = replace_address[0];
				address.insert(address.begin() + 1, replace_address.begin() + 1, replace_address.end());
				return address;
			}
		}

		ancestor = ancestor->GetParentNode();
	}

	Log::Message(Log::LT_WARNING, "Could not find variable name '%s' in data model.", address_str.c_str());

	return DataAddress();
}